

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

unique_ptr<Expression,_std::default_delete<Expression>_> __thiscall
Parser::parseIdentifierExpression(Parser *this)

{
  Token *this_00;
  TokenType TVar1;
  TokenType TVar2;
  FunctionCallExpression *this_01;
  CalculationEngine *this_02;
  undefined8 extraout_RAX;
  Parser *in_RSI;
  Parser *this_03;
  unique_ptr<Expression,_std::default_delete<Expression>_> arg;
  vector<std::unique_ptr<Expression,_std::default_delete<Expression>_>,_std::allocator<std::unique_ptr<Expression,_std::default_delete<Expression>_>_>_>
  arguments;
  string identifier;
  undefined1 local_f0 [8];
  vector<std::unique_ptr<Expression,_std::default_delete<Expression>_>,_std::allocator<std::unique_ptr<Expression,_std::default_delete<Expression>_>_>_>
  local_e8;
  string local_c8;
  string local_a8;
  string local_88;
  undefined1 local_68 [32];
  vector<std::unique_ptr<Expression,_std::default_delete<Expression>_>,_std::allocator<std::unique_ptr<Expression,_std::default_delete<Expression>_>_>_>
  local_48;
  
  this_00 = &in_RSI->mCurrentToken;
  Token::identifier_abi_cxx11_(&local_c8,this_00);
  nextToken(in_RSI);
  TVar1 = Token::type(this_00);
  if (TVar1 == LEFT_PARENTHESIS) {
    nextToken(in_RSI);
    local_e8.
    super__Vector_base<std::unique_ptr<Expression,_std::default_delete<Expression>_>,_std::allocator<std::unique_ptr<Expression,_std::default_delete<Expression>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_e8.
    super__Vector_base<std::unique_ptr<Expression,_std::default_delete<Expression>_>,_std::allocator<std::unique_ptr<Expression,_std::default_delete<Expression>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_e8.
    super__Vector_base<std::unique_ptr<Expression,_std::default_delete<Expression>_>,_std::allocator<std::unique_ptr<Expression,_std::default_delete<Expression>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    TVar1 = Token::type(this_00);
    if (TVar1 != RIGHT_PARENTHESIS) {
      do {
        parseExpression((Parser *)local_f0);
        std::
        vector<std::unique_ptr<Expression,std::default_delete<Expression>>,std::allocator<std::unique_ptr<Expression,std::default_delete<Expression>>>>
        ::emplace_back<std::unique_ptr<Expression,std::default_delete<Expression>>>
                  ((vector<std::unique_ptr<Expression,std::default_delete<Expression>>,std::allocator<std::unique_ptr<Expression,std::default_delete<Expression>>>>
                    *)&local_e8,(unique_ptr<Expression,_std::default_delete<Expression>_> *)local_f0
                  );
        TVar1 = Token::type(this_00);
        if (TVar1 != RIGHT_PARENTHESIS) {
          TVar2 = Token::type(this_00);
          if (TVar2 != COMMA) {
            this_03 = (Parser *)local_68;
            local_68._0_8_ = (CalculationEngine *)(local_68 + 0x10);
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)this_03,"Expected \',\' or \')\' in argument list.","");
            parseError(this_03,(string *)local_68);
            std::
            vector<std::unique_ptr<Expression,_std::default_delete<Expression>_>,_std::allocator<std::unique_ptr<Expression,_std::default_delete<Expression>_>_>_>
            ::~vector(&local_48);
            if ((Token *)local_a8._M_dataplus._M_p != this_00) {
              operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
            }
            operator_delete((CalculationEngine *)(local_68 + 0x10),0x40);
            std::
            vector<std::unique_ptr<Expression,_std::default_delete<Expression>_>,_std::allocator<std::unique_ptr<Expression,_std::default_delete<Expression>_>_>_>
            ::~vector(&local_e8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
              operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
            }
            _Unwind_Resume(extraout_RAX);
          }
          nextToken(in_RSI);
        }
        if (local_f0 != (undefined1  [8])0x0) {
          (**(code **)(*(long *)local_f0 + 8))();
        }
      } while (TVar1 != RIGHT_PARENTHESIS);
    }
    nextToken(in_RSI);
    this_01 = (FunctionCallExpression *)operator_new(0x40);
    local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_a8,local_c8._M_dataplus._M_p,
               (pointer)(local_c8._M_string_length + (long)local_c8._M_dataplus._M_p));
    local_48.
    super__Vector_base<std::unique_ptr<Expression,_std::default_delete<Expression>_>,_std::allocator<std::unique_ptr<Expression,_std::default_delete<Expression>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         local_e8.
         super__Vector_base<std::unique_ptr<Expression,_std::default_delete<Expression>_>,_std::allocator<std::unique_ptr<Expression,_std::default_delete<Expression>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_48.
    super__Vector_base<std::unique_ptr<Expression,_std::default_delete<Expression>_>,_std::allocator<std::unique_ptr<Expression,_std::default_delete<Expression>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_e8.
         super__Vector_base<std::unique_ptr<Expression,_std::default_delete<Expression>_>,_std::allocator<std::unique_ptr<Expression,_std::default_delete<Expression>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_48.
    super__Vector_base<std::unique_ptr<Expression,_std::default_delete<Expression>_>,_std::allocator<std::unique_ptr<Expression,_std::default_delete<Expression>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_e8.
         super__Vector_base<std::unique_ptr<Expression,_std::default_delete<Expression>_>,_std::allocator<std::unique_ptr<Expression,_std::default_delete<Expression>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_e8.
    super__Vector_base<std::unique_ptr<Expression,_std::default_delete<Expression>_>,_std::allocator<std::unique_ptr<Expression,_std::default_delete<Expression>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_e8.
    super__Vector_base<std::unique_ptr<Expression,_std::default_delete<Expression>_>,_std::allocator<std::unique_ptr<Expression,_std::default_delete<Expression>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_e8.
    super__Vector_base<std::unique_ptr<Expression,_std::default_delete<Expression>_>,_std::allocator<std::unique_ptr<Expression,_std::default_delete<Expression>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    FunctionCallExpression::FunctionCallExpression(this_01,&local_a8,&local_48);
    this->mCalcEngine = (CalculationEngine *)this_01;
    std::
    vector<std::unique_ptr<Expression,_std::default_delete<Expression>_>,_std::allocator<std::unique_ptr<Expression,_std::default_delete<Expression>_>_>_>
    ::~vector(&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<std::unique_ptr<Expression,_std::default_delete<Expression>_>,_std::allocator<std::unique_ptr<Expression,_std::default_delete<Expression>_>_>_>
    ::~vector(&local_e8);
  }
  else {
    this_02 = (CalculationEngine *)operator_new(0x28);
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_88,local_c8._M_dataplus._M_p,
               (pointer)(local_c8._M_string_length + (long)local_c8._M_dataplus._M_p));
    VariableExpression::VariableExpression((VariableExpression *)this_02,&local_88);
    this->mCalcEngine = this_02;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  return (__uniq_ptr_data<Expression,_std::default_delete<Expression>,_true,_true>)
         (__uniq_ptr_data<Expression,_std::default_delete<Expression>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Expression> Parser::parseIdentifierExpression() {
	std::string identifier = mCurrentToken.identifier();

	//Eat the identifier.
	nextToken();

	if (mCurrentToken.type() != TokenType::LEFT_PARENTHESIS) {
		return std::unique_ptr<VariableExpression>(new VariableExpression(identifier));
	}

	//Function call
	nextToken(); //Eat the '('
	std::vector<std::unique_ptr<Expression>> arguments;

	if (mCurrentToken.type() != TokenType::RIGHT_PARENTHESIS) {
		while (true) {
			auto arg = parseExpression();
			arguments.push_back(std::move(arg));

			if (mCurrentToken.type() == TokenType::RIGHT_PARENTHESIS) {
				break;
			}

			if (mCurrentToken.type() != TokenType::COMMA) {
				parseError("Expected ',' or ')' in argument list.");
			}

			nextToken();
		}
	}

	//Eat the ')'
	nextToken();

	return std::unique_ptr<FunctionCallExpression>(
		new FunctionCallExpression(identifier, std::move(arguments)));
}